

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapDevice.cpp
# Opt level: O0

void __thiscall
TRM::BitmapDevice::Triangle
          (BitmapDevice *this,Vec3f *a,Vec3f *b,Vec3f *c,Color *ca,Color *cb,Color *cc)

{
  undefined1 *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  vec<3,_float,_(glm::qualifier)0> P;
  vec<3,_float,_(glm::qualifier)0> A;
  vec<3,_float,_(glm::qualifier)0> B;
  vec<3,_float,_(glm::qualifier)0> C;
  uint32_t uVar8;
  uint32_t uVar9;
  element_type *peVar10;
  Matrix *m;
  reference pvVar11;
  int *piVar12;
  float *pfVar13;
  reference pvVar14;
  reference pvVar15;
  array<unsigned_char,_4UL> *paVar16;
  byte *pbVar17;
  reference pvVar18;
  float fVar19;
  float fVar20;
  Vec3f VVar21;
  Color local_1dc;
  ulong uStack_1d8;
  Color c_1;
  size_t zIndex;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aStack_1c8;
  float pz;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_1c0;
  undefined1 local_13c [8];
  Vec3f bc_screen;
  Vec3f p;
  float local_11c;
  float local_118;
  int local_114;
  int local_110;
  int j;
  int i;
  col_type local_fc;
  undefined8 local_ec;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_e4;
  vec<4,_float,_(glm::qualifier)0> local_e0;
  col_type local_d0;
  undefined8 local_c0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_b8;
  vec<4,_float,_(glm::qualifier)0> local_b4;
  col_type local_a4;
  undefined8 local_94;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_8c;
  undefined1 local_88 [8];
  array<TRM::Color,_3UL> colors;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> pts;
  Vec2i clamp;
  Vec2i bboxmax;
  Vec2i bboxmin;
  int32_t bitmap_height;
  int32_t bitmap_width;
  Color *cb_local;
  Color *ca_local;
  Vec3f *c_local;
  Vec3f *b_local;
  Vec3f *a_local;
  BitmapDevice *this_local;
  
  peVar10 = std::__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&this->mBitmap);
  uVar8 = Bitmap::width(peVar10);
  peVar10 = std::__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&this->mBitmap);
  uVar9 = Bitmap::height(peVar10);
  glm::vec<2,_int,_(glm::qualifier)0>::vec(&bboxmax,uVar8 - 1,uVar9 - 1);
  clamp.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3)0x0;
  clamp.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5)0x0;
  glm::vec<2,_int,_(glm::qualifier)0>::vec
            ((vec<2,_int,_(glm::qualifier)0> *)&pts._M_elems[2].field_1,uVar8 - 1,uVar9 - 1);
  local_88._0_4_ = *(undefined4 *)(ca->fRGBA)._M_elems;
  local_88._4_4_ = *(undefined4 *)(cb->fRGBA)._M_elems;
  colors._0_4_ = *(undefined4 *)(cc->fRGBA)._M_elems;
  m = &this->mMatrix;
  glm::vec<4,_float,_(glm::qualifier)0>::vec
            (&local_b4,(a->field_0).x,(a->field_1).y,(a->field_2).z,1.0);
  local_a4 = glm::operator*(m,&local_b4);
  glm::vec<3,float,(glm::qualifier)0>::vec<float,(glm::qualifier)0>
            ((vec<3,float,(glm::qualifier)0> *)&local_94,&local_a4);
  pvVar11 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                      ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)&colors.field_0x4,0);
  pvVar11->field_2 = local_8c;
  pvVar11->field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_94;
  pvVar11->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_94._4_4_;
  glm::vec<4,_float,_(glm::qualifier)0>::vec
            (&local_e0,(b->field_0).x,(b->field_1).y,(b->field_2).z,1.0);
  local_d0 = glm::operator*(m,&local_e0);
  glm::vec<3,float,(glm::qualifier)0>::vec<float,(glm::qualifier)0>
            ((vec<3,float,(glm::qualifier)0> *)&local_c0,&local_d0);
  pvVar11 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                      ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)&colors.field_0x4,1);
  pvVar11->field_2 = local_b8;
  pvVar11->field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_c0;
  pvVar11->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_c0._4_4_;
  glm::vec<4,_float,_(glm::qualifier)0>::vec
            ((vec<4,_float,_(glm::qualifier)0> *)&j,(c->field_0).x,(c->field_1).y,(c->field_2).z,1.0
            );
  local_fc = glm::operator*(m,(vec<4,_float,_(glm::qualifier)0> *)&j);
  glm::vec<3,float,(glm::qualifier)0>::vec<float,(glm::qualifier)0>
            ((vec<3,float,(glm::qualifier)0> *)&local_ec,&local_fc);
  pvVar11 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                      ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)&colors.field_0x4,2);
  pvVar11->field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_ec;
  pvVar11->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_ec._4_4_;
  pvVar11->field_2 = local_e4;
  for (local_110 = 0; local_110 < 3; local_110 = local_110 + 1) {
    for (local_114 = 0; local_114 < 2; local_114 = local_114 + 1) {
      local_118 = 0.0;
      piVar12 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](&bboxmax,local_114);
      local_11c = (float)*piVar12;
      pvVar11 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                          ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)&colors.field_0x4,
                           (long)local_110);
      pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pvVar11,local_114);
      pfVar13 = std::min<float>(&local_11c,pfVar13);
      pfVar13 = std::max<float>(&local_118,pfVar13);
      fVar19 = *pfVar13;
      piVar12 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](&bboxmax,local_114);
      *piVar12 = (int)fVar19;
      piVar12 = glm::vec<2,_int,_(glm::qualifier)0>::operator[]
                          ((vec<2,_int,_(glm::qualifier)0> *)&pts._M_elems[2].field_1,local_114);
      p.field_2.z = (float)*piVar12;
      piVar12 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](&clamp,local_114);
      p.field_1.y = (float)*piVar12;
      pvVar11 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                          ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)&colors.field_0x4,
                           (long)local_110);
      pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pvVar11,local_114);
      pfVar13 = std::max<float>(&p.field_1.y,pfVar13);
      pfVar13 = std::min<float>(&p.field_2.z,pfVar13);
      fVar19 = *pfVar13;
      piVar12 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](&clamp,local_114);
      *piVar12 = (int)fVar19;
    }
  }
  pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                      ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,0);
  *pfVar13 = (float)bboxmax.field_0.x;
  while( true ) {
    pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                        ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,0);
    if ((float)clamp.field_0.x < *pfVar13) break;
    fVar19 = (float)bboxmax.field_1.y;
    pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                        ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,1);
    *pfVar13 = fVar19;
    while( true ) {
      pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                          ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,1);
      if ((float)clamp.field_1.y < *pfVar13) break;
      puVar1 = &colors.field_0x4;
      pvVar11 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                          ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)puVar1,0);
      A.field_0 = pvVar11->field_0;
      A.field_1 = pvVar11->field_1;
      A.field_2 = pvVar11->field_2;
      pvVar11 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                          ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)puVar1,1);
      B.field_0 = pvVar11->field_0;
      B.field_1 = pvVar11->field_1;
      B.field_2 = pvVar11->field_2;
      pvVar11 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                          ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)puVar1,2);
      C.field_0 = pvVar11->field_0;
      C.field_1 = pvVar11->field_1;
      C.field_2 = pvVar11->field_2;
      P.field_1.y = bc_screen.field_2.z;
      P.field_0.x = bc_screen.field_1.y;
      P.field_2.z = p.field_0.x;
      VVar21 = barycentric<3ul>(A,B,C,P);
      _aStack_1c8 = VVar21._0_8_;
      local_13c._0_4_ = aStack_1c8;
      local_13c._4_4_ = pz;
      local_1c0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)VVar21.field_2;
      bc_screen.field_0 = local_1c0;
      pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                          ((vec<3,_float,_(glm::qualifier)0> *)local_13c,0);
      if (((0.0 < *pfVar13 || *pfVar13 == 0.0) &&
          (pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                               ((vec<3,_float,_(glm::qualifier)0> *)local_13c,1),
          0.0 < *pfVar13 || *pfVar13 == 0.0)) &&
         (pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_13c,2),
         0.0 < *pfVar13 || *pfVar13 == 0.0)) {
        puVar1 = &colors.field_0x4;
        pvVar11 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                            ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)puVar1,0);
        pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pvVar11,2);
        fVar19 = *pfVar13;
        pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_13c,0);
        fVar20 = *pfVar13;
        pvVar11 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                            ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)puVar1,1);
        pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pvVar11,2);
        fVar2 = *pfVar13;
        pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_13c,1);
        fVar3 = *pfVar13;
        pvVar11 = std::array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL>::operator[]
                            ((array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> *)puVar1,2);
        pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pvVar11,2);
        fVar4 = *pfVar13;
        pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_13c,2);
        fVar19 = fVar4 * *pfVar13 + fVar19 * fVar20 + fVar2 * fVar3;
        fVar20 = bc_screen.field_2.z * (float)(int)uVar8 + bc_screen.field_1.y;
        uStack_1d8 = (ulong)fVar20;
        uStack_1d8 = uStack_1d8 | (long)(fVar20 - 9.223372e+18) & (long)uStack_1d8 >> 0x3f;
        pvVar14 = std::vector<float,_std::allocator<float>_>::operator[](&this->mZBuffer,uStack_1d8)
        ;
        if (fVar19 <= *pvVar14) {
          pvVar14 = std::vector<float,_std::allocator<float>_>::operator[]
                              (&this->mZBuffer,uStack_1d8);
          *pvVar14 = fVar19;
          Color::Color(&local_1dc);
          pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_13c,0);
          fVar19 = *pfVar13;
          pvVar15 = std::array<TRM::Color,_3UL>::operator[]((array<TRM::Color,_3UL> *)local_88,0);
          paVar16 = Color::rgba(pvVar15);
          pbVar17 = std::array<unsigned_char,_4UL>::operator[](paVar16,0);
          bVar5 = *pbVar17;
          pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_13c,1);
          fVar20 = *pfVar13;
          pvVar15 = std::array<TRM::Color,_3UL>::operator[]((array<TRM::Color,_3UL> *)local_88,1);
          paVar16 = Color::rgba(pvVar15);
          pbVar17 = std::array<unsigned_char,_4UL>::operator[](paVar16,0);
          bVar6 = *pbVar17;
          pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_13c,2);
          fVar2 = *pfVar13;
          pvVar15 = std::array<TRM::Color,_3UL>::operator[]((array<TRM::Color,_3UL> *)local_88,2);
          paVar16 = Color::rgba(pvVar15);
          pbVar17 = std::array<unsigned_char,_4UL>::operator[](paVar16,0);
          bVar7 = *pbVar17;
          paVar16 = Color::rgba(&local_1dc);
          pvVar18 = std::array<unsigned_char,_4UL>::operator[](paVar16,0);
          *pvVar18 = (value_type_conflict1)
                     (int)(fVar2 * (float)bVar7 + fVar19 * (float)bVar5 + fVar20 * (float)bVar6);
          pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_13c,0);
          fVar19 = *pfVar13;
          pvVar15 = std::array<TRM::Color,_3UL>::operator[]((array<TRM::Color,_3UL> *)local_88,0);
          paVar16 = Color::rgba(pvVar15);
          pbVar17 = std::array<unsigned_char,_4UL>::operator[](paVar16,1);
          bVar5 = *pbVar17;
          pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_13c,1);
          fVar20 = *pfVar13;
          pvVar15 = std::array<TRM::Color,_3UL>::operator[]((array<TRM::Color,_3UL> *)local_88,1);
          paVar16 = Color::rgba(pvVar15);
          pbVar17 = std::array<unsigned_char,_4UL>::operator[](paVar16,1);
          bVar6 = *pbVar17;
          pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_13c,2);
          fVar2 = *pfVar13;
          pvVar15 = std::array<TRM::Color,_3UL>::operator[]((array<TRM::Color,_3UL> *)local_88,2);
          paVar16 = Color::rgba(pvVar15);
          pbVar17 = std::array<unsigned_char,_4UL>::operator[](paVar16,1);
          bVar7 = *pbVar17;
          paVar16 = Color::rgba(&local_1dc);
          pvVar18 = std::array<unsigned_char,_4UL>::operator[](paVar16,1);
          *pvVar18 = (value_type_conflict1)
                     (int)(fVar2 * (float)bVar7 + fVar19 * (float)bVar5 + fVar20 * (float)bVar6);
          pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_13c,0);
          fVar19 = *pfVar13;
          pvVar15 = std::array<TRM::Color,_3UL>::operator[]((array<TRM::Color,_3UL> *)local_88,0);
          paVar16 = Color::rgba(pvVar15);
          pbVar17 = std::array<unsigned_char,_4UL>::operator[](paVar16,2);
          bVar5 = *pbVar17;
          pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_13c,1);
          fVar20 = *pfVar13;
          pvVar15 = std::array<TRM::Color,_3UL>::operator[]((array<TRM::Color,_3UL> *)local_88,1);
          paVar16 = Color::rgba(pvVar15);
          pbVar17 = std::array<unsigned_char,_4UL>::operator[](paVar16,2);
          bVar6 = *pbVar17;
          pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_13c,2);
          fVar2 = *pfVar13;
          pvVar15 = std::array<TRM::Color,_3UL>::operator[]((array<TRM::Color,_3UL> *)local_88,2);
          paVar16 = Color::rgba(pvVar15);
          pbVar17 = std::array<unsigned_char,_4UL>::operator[](paVar16,2);
          bVar7 = *pbVar17;
          paVar16 = Color::rgba(&local_1dc);
          pvVar18 = std::array<unsigned_char,_4UL>::operator[](paVar16,2);
          *pvVar18 = (value_type_conflict1)
                     (int)(fVar2 * (float)bVar7 + fVar19 * (float)bVar5 + fVar20 * (float)bVar6);
          pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_13c,0);
          fVar19 = *pfVar13;
          pvVar15 = std::array<TRM::Color,_3UL>::operator[]((array<TRM::Color,_3UL> *)local_88,0);
          paVar16 = Color::rgba(pvVar15);
          pbVar17 = std::array<unsigned_char,_4UL>::operator[](paVar16,3);
          bVar5 = *pbVar17;
          pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_13c,1);
          fVar20 = *pfVar13;
          pvVar15 = std::array<TRM::Color,_3UL>::operator[]((array<TRM::Color,_3UL> *)local_88,1);
          paVar16 = Color::rgba(pvVar15);
          pbVar17 = std::array<unsigned_char,_4UL>::operator[](paVar16,3);
          bVar6 = *pbVar17;
          pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_13c,2);
          fVar2 = *pfVar13;
          pvVar15 = std::array<TRM::Color,_3UL>::operator[]((array<TRM::Color,_3UL> *)local_88,2);
          paVar16 = Color::rgba(pvVar15);
          pbVar17 = std::array<unsigned_char,_4UL>::operator[](paVar16,3);
          bVar7 = *pbVar17;
          paVar16 = Color::rgba(&local_1dc);
          pvVar18 = std::array<unsigned_char,_4UL>::operator[](paVar16,3);
          *pvVar18 = (value_type_conflict1)
                     (int)(fVar2 * (float)bVar7 + fVar19 * (float)bVar5 + fVar20 * (float)bVar6);
          peVar10 = std::__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->mBitmap);
          Bitmap::SetPixel(peVar10,(uint32_t)(long)bc_screen.field_1.y,
                           (uint32_t)(long)bc_screen.field_2.z,&local_1dc);
        }
      }
      pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                          ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,1);
      *pfVar13 = *pfVar13 + 1.0;
    }
    pfVar13 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                        ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,0);
    *pfVar13 = *pfVar13 + 1.0;
  }
  return;
}

Assistant:

void BitmapDevice::Triangle(Vec3f const& a, Vec3f const& b, Vec3f const& c,
                            Color const& ca, Color const& cb, Color const& cc) {
  int32_t bitmap_width = mBitmap->width();
  int32_t bitmap_height = mBitmap->height();

  Vec2i bboxmin(bitmap_width - 1, bitmap_height - 1);
  Vec2i bboxmax(0, 0);
  Vec2i clamp(bitmap_width - 1, bitmap_height - 1);

  std::array<Vec3f, 3> pts;
  std::array<Color, 3> colors{ca, cb, cc};

  pts[0] = mMatrix * Vec4f{a.x, a.y, a.z, 1.f};
  pts[1] = mMatrix * Vec4f{b.x, b.y, b.z, 1.f};
  pts[2] = mMatrix * Vec4f{c.x, c.y, c.z, 1.f};

  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = (int)std::max(
          0.f, std::min(static_cast<float>(bboxmin[j]), pts[i][j]));
      bboxmax[j] =
          (int)std::min(static_cast<float>(clamp[j]),
                        std::max(static_cast<float>(bboxmax[j]), pts[i][j]));
    }
  }

  Vec3f p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<3>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      float pz = pts[0][2] * bc_screen[0] + pts[1][2] * bc_screen[1] +
                 pts[2][2] * bc_screen[2];

      size_t zIndex = static_cast<size_t>(p.x + p.y * bitmap_width);
      if (mZBuffer[zIndex] < pz) continue;

      mZBuffer[zIndex] = pz;

      Color c;
      /*
          barycentric result can also interpolation Color
      */

      c.rgba()[0] = bc_screen[0] * colors[0].rgba()[0] +
                    bc_screen[1] * colors[1].rgba()[0] +
                    bc_screen[2] * colors[2].rgba()[0];
      c.rgba()[1] = bc_screen[0] * colors[0].rgba()[1] +
                    bc_screen[1] * colors[1].rgba()[1] +
                    bc_screen[2] * colors[2].rgba()[1];
      c.rgba()[2] = bc_screen[0] * colors[0].rgba()[2] +
                    bc_screen[1] * colors[1].rgba()[2] +
                    bc_screen[2] * colors[2].rgba()[2];
      c.rgba()[3] = bc_screen[0] * colors[0].rgba()[3] +
                    bc_screen[1] * colors[1].rgba()[3] +
                    bc_screen[2] * colors[2].rgba()[3];

      mBitmap->SetPixel(static_cast<uint32_t>(p.x), static_cast<uint32_t>(p.y),
                        c);
    }
  }
}